

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O0

void __thiscall Simplex::unboundedDebug(Simplex *this)

{
  longdouble lVar1;
  uint uVar2;
  uint uVar3;
  int *in_RDI;
  int i_1;
  int i;
  Simplex *in_stack_ffffffffffffffc0;
  FILE *__stream;
  uint local_10;
  uint local_c;
  
  fprintf(_stderr,"Unbounded:\n");
  printObjective(in_stack_ffffffffffffffc0);
  fprintf(_stderr,"Pivot row = %d\n",(ulong)(uint)in_RDI[0x55]);
  fprintf(_stderr,"RHS = %.3Lf\n");
  fprintf(_stderr,"Row: ");
  for (local_c = 0; (int)local_c < *in_RDI + in_RDI[1]; local_c = local_c + 1) {
    lVar1 = *(longdouble *)(*(long *)(in_RDI + 0x5c) + (long)(int)local_c * 0x10);
    if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
      fprintf(_stderr,"%d:",(ulong)local_c);
      fprintf(_stderr,"%.3Lf/%.3Lf, ");
    }
  }
  for (local_10 = 0; (int)local_10 < *in_RDI; local_10 = local_10 + 1) {
    __stream = _stderr;
    uVar2 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x46) + (long)(int)local_10 * 4))
    ;
    uVar3 = Tint::operator_cast_to_int((Tint *)(*(long *)(in_RDI + 0x48) + (long)(int)local_10 * 4))
    ;
    fprintf(__stream,"%d:%d %d, ",(ulong)local_10,(ulong)uVar2,(ulong)uVar3);
  }
  return;
}

Assistant:

void Simplex::unboundedDebug() const {
	fprintf(stderr, "Unbounded:\n");
	printObjective();
	//		printTableau(true);
	fprintf(stderr, "Pivot row = %d\n", pivot_row);
	fprintf(stderr, "RHS = %.3Lf\n", rhs[pivot_row]);
	fprintf(stderr, "Row: ");
	for (int i = 0; i < n + m; i++) {
		if (row[i] == 0) {
			continue;
		}
		fprintf(stderr, "%d:", i);
		fprintf(stderr, "%.3Lf/%.3Lf, ", obj[i], row[i]);
	}
	for (int i = 0; i < n; i++) {
		fprintf(stderr, "%d:%d %d, ", i, (int)lb[i], (int)ub[i]);
	}
}